

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O1

TypeDef winmd::reader::find_required(TypeRef *type)

{
  table_base *ptVar1;
  pointer pTVar2;
  pointer pTVar3;
  database *pdVar4;
  cache *this;
  uint uVar5;
  vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *pvVar6;
  __normal_iterator<const_winmd::reader::TypeDef_*,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>
  _Var7;
  TypeDef TVar8;
  string_view sVar9;
  row_base<winmd::reader::TypeDef> rVar10;
  string_view local_78;
  string_view local_68;
  string local_58;
  string_view local_38;
  
  local_68._M_str._4_4_ = (undefined4)(local_68._M_len >> 0x20);
  local_78._M_str._4_4_ = (undefined4)(local_78._M_len >> 0x20);
  uVar5 = table_base::get_value<unsigned_int>
                    ((type->super_row_base<winmd::reader::TypeRef>).m_table,
                     (type->super_row_base<winmd::reader::TypeRef>).m_index,0);
  if ((~uVar5 & 3) == 0) {
    ptVar1 = (type->super_row_base<winmd::reader::TypeRef>).m_table;
    uVar5 = table_base::get_value<unsigned_int>
                      (ptVar1,(type->super_row_base<winmd::reader::TypeRef>).m_index,0);
    local_78._M_str._0_4_ = (uVar5 >> 2) - 1;
    local_78._M_len = (size_t)ptVar1->m_database;
    TVar8 = find_required((TypeRef *)&local_78);
    local_68._0_12_ = TVar8.super_row_base<winmd::reader::TypeDef>._0_12_;
    pvVar6 = cache::nested_types((TVar8.super_row_base<winmd::reader::TypeDef>.m_table)->m_database
                                 ->m_cache,(TypeDef *)&local_68);
    pTVar2 = (pvVar6->
             super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pTVar3 = (pvVar6->
             super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    ptVar1 = (type->super_row_base<winmd::reader::TypeRef>).m_table;
    pdVar4 = ptVar1->m_database;
    uVar5 = table_base::get_value<unsigned_int>
                      (ptVar1,(type->super_row_base<winmd::reader::TypeRef>).m_index,1);
    sVar9 = database::get_string(pdVar4,uVar5);
    _Var7 = std::
            __find_if<__gnu_cxx::__normal_iterator<winmd::reader::TypeDef_const*,std::vector<winmd::reader::TypeDef,std::allocator<winmd::reader::TypeDef>>>,__gnu_cxx::__ops::_Iter_pred<winmd::reader::find_required(winmd::reader::TypeRef_const&)::_lambda(winmd::reader::TypeDef_const&)_1_>>
                      (pTVar2,pTVar3,sVar9._M_len,sVar9._M_str);
    if (_Var7._M_current ==
        (pvVar6->super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Type \'","");
      local_78 = TypeDef::TypeName((TypeDef *)&local_68);
      local_38 = TypeRef::TypeName(type);
      impl::
      throw_invalid<std::basic_string_view<char,std::char_traits<char>>,char[2],std::basic_string_view<char,std::char_traits<char>>,char[21]>
                (&local_58,&local_78,(char (*) [2])0x18c77b,&local_38,
                 (char (*) [21])"\' could not be found");
    }
    rVar10._12_4_ = 0;
    rVar10.m_table = ((_Var7._M_current)->super_row_base<winmd::reader::TypeDef>).m_table;
    rVar10.m_index = ((_Var7._M_current)->super_row_base<winmd::reader::TypeDef>).m_index;
  }
  else {
    ptVar1 = (type->super_row_base<winmd::reader::TypeRef>).m_table;
    this = ptVar1->m_database->m_cache;
    pdVar4 = ptVar1->m_database;
    uVar5 = table_base::get_value<unsigned_int>
                      (ptVar1,(type->super_row_base<winmd::reader::TypeRef>).m_index,2);
    local_68 = database::get_string(pdVar4,uVar5);
    ptVar1 = (type->super_row_base<winmd::reader::TypeRef>).m_table;
    pdVar4 = ptVar1->m_database;
    uVar5 = table_base::get_value<unsigned_int>
                      (ptVar1,(type->super_row_base<winmd::reader::TypeRef>).m_index,1);
    local_78 = database::get_string(pdVar4,uVar5);
    rVar10 = (row_base<winmd::reader::TypeDef>)cache::find_required(this,&local_68,&local_78);
  }
  return (TypeDef)rVar10;
}

Assistant:

inline auto find_required(TypeRef const& type)
    {
        if (type.ResolutionScope().type() != ResolutionScope::TypeRef)
        {
            return type.get_database().get_cache().find_required(type.TypeNamespace(), type.TypeName());
        }
        else
        {
            auto enclosing_type = find_required(type.ResolutionScope().TypeRef());
            auto const& nested_types = enclosing_type.get_cache().nested_types(enclosing_type);
            auto iter = std::find_if(nested_types.begin(), nested_types.end(),
                [name = type.TypeName()](TypeDef const& arg)
            {
                return name == arg.TypeName();
            });
            if (iter == nested_types.end())
            {
                impl::throw_invalid("Type '", enclosing_type.TypeName(), ".", type.TypeName(), "' could not be found");
            }
            return *iter;
        }
    }